

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_posix::std_converter<wchar_t>::convert_abi_cxx11_
          (std_converter<wchar_t> *this,conversion_type how,char_type_conflict *begin,
          char_type_conflict *end,int param_5)

{
  wchar_t wVar1;
  ulong uVar2;
  wchar_t *in_RCX;
  int in_EDX;
  string_type *in_RDI;
  wchar_t *in_R8;
  string_type *res;
  locale_t in_stack_ffffffffffffff78;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff80;
  allocator local_3e;
  undefined1 local_3d;
  undefined1 local_2d;
  wchar_t *local_28;
  wchar_t *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  if (in_EDX == 1) {
    local_2d = 0;
    std::__cxx11::wstring::wstring((wstring *)in_RDI);
    std::__cxx11::wstring::reserve((ulong)in_RDI);
    while (local_20 != local_28) {
      local_20 = local_20 + 1;
      std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*(in_stack_ffffffffffffff80);
      wVar1 = case_traits<wchar_t>::upper
                        ((wchar_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         in_stack_ffffffffffffff78);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,wVar1);
    }
  }
  else if (in_EDX - 2U < 2) {
    local_3d = 0;
    std::__cxx11::wstring::wstring((wstring *)in_RDI);
    std::__cxx11::wstring::reserve((ulong)in_RDI);
    while (local_20 != local_28) {
      local_20 = local_20 + 1;
      std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*(in_stack_ffffffffffffff80);
      wVar1 = case_traits<wchar_t>::lower
                        ((wchar_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         in_stack_ffffffffffffff78);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,wVar1);
    }
  }
  else {
    uVar2 = (long)in_R8 - (long)in_RCX >> 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring((wstring *)in_RDI,in_RCX,uVar2,&local_3e);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_3e);
  }
  return in_RDI;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case converter_base::upper_case:
            {
                string_type res;
                res.reserve(end-begin);
                while(begin!=end) {
                    res+=case_traits<char_type>::upper(*begin++,*lc_);
                }
                return res;
            }
        case converter_base::lower_case:
        case converter_base::case_folding:
            {
                string_type res;
                res.reserve(end-begin);
                while(begin!=end) {
                    res+=case_traits<char_type>::lower(*begin++,*lc_);
                }
                return res;
            }
        default:
            return string_type(begin,end-begin);
        }
    }